

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O2

void av1_convolve_y_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_y,int32_t subpel_y_qn)

{
  uint uVar1;
  uint uVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  int iVar13;
  long lVar14;
  __m256i *stride;
  long lVar15;
  ptrdiff_t stride_00;
  int16_t *stride_01;
  uint uVar16;
  uint8_t *extraout_RDX;
  long lVar17;
  uint8_t *extraout_RDX_00;
  uint8_t *extraout_RDX_01;
  uint8_t *extraout_RDX_02;
  ulong uVar18;
  uint8_t *extraout_RDX_03;
  int32_t iVar19;
  long lVar20;
  uint8_t *puVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 (*pauVar25) [32];
  ulong *puVar26;
  short *psVar27;
  uint *puVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  __m256i alVar50;
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar52 [32];
  __m128i coeffs_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  __m128i res;
  __m128i res_00;
  __m128i res_01;
  __m128i res_02;
  __m256i coeffs [6];
  __m256i coeffs_256 [4];
  __m256i tt_256 [4];
  __m256i ss_256 [4];
  __m256i r_1 [4];
  undefined1 (*local_758) [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_600 [16];
  undefined1 local_5e0 [16];
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  __m256i local_3a0;
  __m256i local_380;
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  __m256i local_300;
  __m256i local_2e0;
  __m256i local_2c0;
  __m256i local_2a0;
  __m256i local_280;
  __m256i local_260;
  __m256i local_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  __m256i local_1e0;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  longlong lStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  __m256i local_160;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  longlong lStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  longlong local_e0 [22];
  undefined1 auVar64 [32];
  undefined1 auVar97 [32];
  
  iVar13 = get_filter_tap(filter_params_y,subpel_y_qn);
  if (iVar13 == 0xc) {
    iVar13 = get_filter_tap(filter_params_y,subpel_y_qn);
    local_758 = (undefined1 (*) [16])dst;
    if (iVar13 == 6) {
      prepare_coeffs_6t_lowbd(filter_params_y,subpel_y_qn,&local_460);
      lVar14 = (long)(src_stride * 2);
      lVar15 = (long)src_stride;
      lVar20 = (long)dst_stride;
      lVar23 = src_stride * 6 - lVar14;
      lVar22 = src_stride * 5 - lVar14;
      for (lVar30 = 0; lVar17 = w - lVar30, lVar30 < w; lVar30 = lVar30 + 0x10) {
        lVar24 = lVar30 - lVar14;
        auVar38 = *(undefined1 (*) [16])(src + lVar15 + lVar24);
        auVar74 = *(undefined1 (*) [16])(src + lVar14 + lVar24);
        auVar39 = *(undefined1 (*) [16])(src + lVar15 * 3 + lVar24);
        auVar142._0_16_ =
             ZEXT116(0) * auVar38 + ZEXT116(1) * *(undefined1 (*) [16])(src + (lVar30 - lVar14));
        auVar142._16_16_ = ZEXT116(1) * auVar38;
        auVar107._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
        auVar107._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
        auVar149._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar74;
        auVar149._16_16_ = ZEXT116(1) * auVar39;
        auVar38 = *(undefined1 (*) [16])(src + lVar15 * 4 + lVar24);
        auVar74 = local_460._0_16_;
        auVar163._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
        auVar163._32_32_ = in_ZMM7._32_32_;
        auVar163._16_16_ = ZEXT116(1) * auVar74;
        auVar127._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar39;
        auVar127._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
        auVar150 = vpunpcklbw_avx2(auVar142,auVar107);
        auVar165 = vpunpcklbw_avx2(auVar149,auVar127);
        auVar51 = vpunpckhbw_avx2(auVar142,auVar107);
        auVar137 = vpunpckhbw_avx2(auVar149,auVar127);
        pauVar29 = local_758;
        puVar32 = src;
        for (lVar24 = 0; lVar24 < h; lVar24 = lVar24 + 2) {
          auVar38 = *(undefined1 (*) [16])(puVar32 + lVar22);
          auVar128._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar163._0_16_;
          auVar128._16_16_ = ZEXT116(0) * auVar163._16_16_ + ZEXT116(1) * auVar38;
          auVar39 = *(undefined1 (*) [16])(puVar32 + lVar23);
          auVar157._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar38;
          auVar157._16_16_ = ZEXT116(1) * auVar39;
          auVar88 = vpunpcklbw_avx2(auVar128,auVar157);
          auVar154 = vpunpckhbw_avx2(auVar128,auVar157);
          auVar150 = vpmaddubsw_avx2(auVar150,(undefined1  [32])local_460);
          auVar124 = vpmaddubsw_avx2(auVar165,local_440);
          auVar150 = vpaddw_avx2(auVar150,auVar124);
          auVar124 = vpmaddubsw_avx2(auVar88,local_420);
          auVar158._8_2_ = 0x20;
          auVar158._0_8_ = 0x20002000200020;
          auVar158._10_2_ = 0x20;
          auVar158._12_2_ = 0x20;
          auVar158._14_2_ = 0x20;
          auVar158._16_2_ = 0x20;
          auVar158._18_2_ = 0x20;
          auVar158._20_2_ = 0x20;
          auVar158._22_2_ = 0x20;
          auVar158._24_2_ = 0x20;
          auVar158._26_2_ = 0x20;
          auVar158._28_2_ = 0x20;
          auVar158._30_2_ = 0x20;
          auVar150 = vpaddw_avx2(auVar150,auVar158);
          auVar150 = vpaddw_avx2(auVar150,auVar124);
          auVar150 = vpsraw_avx2(auVar150,6);
          auVar150 = vpackuswb_avx2(auVar150,auVar150);
          if (lVar17 < 9) {
            if (lVar17 < 5) {
              if (lVar17 < 3) {
                vpextrw_avx(auVar150._0_16_,0);
                vpextrw_avx(auVar150._16_16_,0);
              }
              else {
                *(int *)*pauVar29 = auVar150._0_4_;
                *(int *)(*pauVar29 + lVar20) = auVar150._16_4_;
              }
            }
            else {
              *(long *)*pauVar29 = auVar150._0_8_;
              *(long *)(*pauVar29 + lVar20) = auVar150._16_8_;
            }
          }
          else {
            auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_460);
            auVar124 = vpmaddubsw_avx2(auVar137,local_440);
            auVar51 = vpaddw_avx2(auVar51,auVar124);
            auVar124 = vpmaddubsw_avx2(auVar154,local_420);
            auVar51 = vpaddw_avx2(auVar51,auVar158);
            auVar51 = vpaddw_avx2(auVar51,auVar124);
            auVar51 = vpsraw_avx2(auVar51,6);
            auVar51 = vpackuswb_avx2(auVar51,(undefined1  [32])local_460);
            auVar51 = vpunpcklqdq_avx2(auVar150,auVar51);
            *pauVar29 = auVar51._0_16_;
            *(undefined1 (*) [16])(*pauVar29 + lVar20) = auVar51._16_16_;
          }
          auVar163 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                         ZEXT116(1) * auVar74,
                                         ZEXT116(0) * auVar74 + ZEXT116(1) * auVar39));
          pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar20 * 2);
          puVar32 = puVar32 + lVar15 * 2;
          auVar150 = auVar165;
          auVar51 = auVar137;
          auVar165 = auVar88;
          auVar137 = auVar154;
        }
        local_758 = local_758 + 1;
        lVar23 = lVar23 + 0x10;
        lVar22 = lVar22 + 0x10;
        in_ZMM7 = auVar163;
      }
    }
    else if (iVar13 == 0xc) {
      prepare_coeffs_12taps(filter_params_y,subpel_y_qn,&local_460);
      local_600._0_8_ = SEXT48((int)(((filter_params_y->taps >> 1) - 1) * src_stride));
      local_220._0_8_ = (long)src - local_600._0_8_;
      lVar22 = (long)src_stride;
      lVar15 = (long)(src_stride * 0xc) - local_600._0_8_;
      local_600._0_8_ = (long)(src_stride * 0xb) - local_600._0_8_;
      lVar14 = (long)dst_stride;
      local_200._0_8_ = (long)w;
      lVar23 = 0;
      while( true ) {
        lVar20 = local_200._0_8_ - lVar23;
        if ((long)local_200._0_8_ <= lVar23) break;
        lVar30 = local_220._0_8_ + lVar23;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(lVar22 + lVar30);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(local_220._0_8_ + lVar23);
        auVar78._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar33;
        auVar78._16_16_ = ZEXT116(1) * auVar54;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar30 + lVar22 * 2);
        auVar62._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar54;
        auVar62._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)(lVar22 * 3 + lVar30);
        auVar106._0_16_ = ZEXT116(0) * auVar89 + ZEXT116(1) * auVar34;
        auVar106._16_16_ = ZEXT116(1) * auVar89;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(lVar30 + lVar22 * 4);
        auVar95._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar89;
        auVar95._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = *(ulong *)(lVar22 * 5 + lVar30);
        auVar126._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar35;
        auVar126._16_16_ = ZEXT116(1) * auVar115;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(lVar22 * 6 + lVar30);
        auVar118._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar115;
        auVar118._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)(lVar22 * 7 + lVar30);
        auVar141._0_16_ = ZEXT116(0) * auVar134 + ZEXT116(1) * auVar36;
        auVar141._16_16_ = ZEXT116(1) * auVar134;
        uVar18 = *(ulong *)(lVar30 + lVar22 * 8);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar18;
        auVar135._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar134;
        auVar135._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = *(ulong *)(lVar22 * 9 + lVar30);
        auVar156._0_16_ = ZEXT116(0) * auVar147 + ZEXT116(1) * auVar37;
        auVar156._16_16_ = ZEXT116(1) * auVar147;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar18;
        auVar159._8_8_ = 0;
        auVar159._0_8_ = *(ulong *)(lVar22 * 10 + lVar30);
        auVar38 = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar159;
        auVar53 = ZEXT116(1) * auVar53;
        auVar148._0_16_ = ZEXT116(0) * auVar159 + ZEXT116(1) * auVar147;
        auVar148._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar159;
        auVar155 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar51 = vpunpcklbw_avx2(auVar78,auVar155);
        auVar137 = vpunpcklbw_avx2(auVar62,auVar155);
        auVar150 = vpunpcklbw_avx2(auVar106,auVar155);
        auVar165 = vpunpcklbw_avx2(auVar95,auVar155);
        auVar124 = vpunpcklbw_avx2(auVar126,auVar155);
        auVar154 = vpunpcklbw_avx2(auVar118,auVar155);
        auVar88 = vpunpcklbw_avx2(auVar141,auVar155);
        auVar133 = vpunpcklbw_avx2(auVar135,auVar155);
        auVar131 = vpunpcklbw_avx2(auVar156,auVar155);
        auVar155 = vpunpcklbw_avx2(auVar148,auVar155);
        local_3a0 = (__m256i)vpunpcklwd_avx2(auVar51,auVar137);
        local_380 = (__m256i)vpunpcklwd_avx2(auVar150,auVar165);
        local_360 = (__m256i)vpunpcklwd_avx2(auVar124,auVar154);
        local_340 = (__m256i)vpunpcklwd_avx2(auVar88,auVar133);
        local_320 = (__m256i)vpunpcklwd_avx2(auVar131,auVar155);
        local_2e0 = (__m256i)vpunpckhwd_avx2(auVar51,auVar137);
        local_2c0 = (__m256i)vpunpckhwd_avx2(auVar150,auVar165);
        local_2a0 = (__m256i)vpunpckhwd_avx2(auVar124,auVar154);
        local_280 = (__m256i)vpunpckhwd_avx2(auVar88,auVar133);
        local_260 = (__m256i)vpunpckhwd_avx2(auVar131,auVar155);
        pauVar29 = local_758;
        puVar32 = src;
        for (lVar30 = 0; alVar12 = local_260, alVar11 = local_280, alVar10 = local_2a0,
            alVar9 = local_2c0, alVar8 = local_320, alVar7 = local_340, alVar6 = local_360,
            alVar5 = local_380, lVar30 < h; lVar30 = lVar30 + 2) {
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)(puVar32 + local_600._0_8_);
          auVar49._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar38;
          auVar49._16_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar55;
          local_720._8_8_ = 0;
          local_720._0_8_ = *(ulong *)(puVar32 + lVar15);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(puVar32 + lVar15);
          auVar63._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar55;
          auVar63._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
          auVar51 = vpunpcklbw_avx2(auVar49,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar137 = vpunpcklbw_avx2(auVar63,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          alVar4 = (__m256i)vpunpcklwd_avx2(auVar51,auVar137);
          alVar3 = (__m256i)vpunpckhwd_avx2(auVar51,auVar137);
          alVar50 = alVar3;
          local_300 = alVar4;
          local_240 = alVar3;
          convolve_12taps(&local_3a0,&local_460);
          auVar79._8_4_ = 0x40;
          auVar79._0_8_ = 0x4000000040;
          auVar79._12_4_ = 0x40;
          auVar79._16_4_ = 0x40;
          auVar79._20_4_ = 0x40;
          auVar79._24_4_ = 0x40;
          auVar79._28_4_ = 0x40;
          auVar51 = vpaddd_avx2((undefined1  [32])alVar50,auVar79);
          auVar51 = vpsrad_avx2(auVar51,7);
          auVar51 = vpackssdw_avx2(auVar51,auVar51);
          auVar137 = vpackuswb_avx2(auVar51,auVar51);
          if (lVar20 < 5) {
            if (lVar20 < 3) {
              vpextrw_avx(auVar137._0_16_,0);
              vpextrw_avx(auVar137._16_16_,0);
            }
            else {
              *(int *)pauVar29 = auVar137._0_4_;
              *(int *)((long)pauVar29 + lVar14) = auVar137._16_4_;
            }
          }
          else {
            convolve_12taps(&local_2e0,&local_460);
            auVar51 = vpaddd_avx2(auVar51,auVar79);
            auVar51 = vpsrad_avx2(auVar51,7);
            auVar51 = vpackssdw_avx2(auVar51,auVar51);
            auVar51 = vpackuswb_avx2(auVar51,auVar51);
            auVar51 = vpunpckldq_avx2(auVar137,auVar51);
            *(long *)pauVar29 = auVar51._0_8_;
            *(long *)((long)pauVar29 + lVar14) = auVar51._16_8_;
          }
          auVar38 = ZEXT116(0) * local_720._0_16_ + ZEXT116(1) * local_720._0_16_;
          auVar53 = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * local_720._0_16_;
          pauVar29 = (undefined1 (*) [16])((long)pauVar29 + lVar14 * 2);
          puVar32 = puVar32 + lVar22 * 2;
          local_3a0 = alVar5;
          local_380 = alVar6;
          local_360 = alVar7;
          local_340 = alVar8;
          local_320 = alVar4;
          local_2e0 = alVar9;
          local_2c0 = alVar10;
          local_2a0 = alVar11;
          local_280 = alVar12;
          local_260 = alVar3;
        }
        lVar23 = lVar23 + 8;
        local_758 = (undefined1 (*) [16])((long)local_758 + 8);
        lVar15 = lVar15 + 8;
        local_600._0_8_ = local_600._0_8_ + 8;
      }
    }
    else {
      prepare_coeffs_lowbd(filter_params_y,subpel_y_qn,&local_460);
      if (iVar13 == 4) {
        lVar15 = (long)src_stride;
        lVar23 = (long)dst_stride;
        lVar22 = src_stride * 6 - lVar15;
        lVar14 = src_stride * 5 - lVar15;
        for (lVar20 = 0; lVar30 = w - lVar20, lVar20 < w; lVar20 = lVar20 + 0x10) {
          lVar17 = lVar20 - lVar15;
          auVar38 = *(undefined1 (*) [16])(src + lVar15 + lVar17);
          auVar74 = *(undefined1 (*) [16])(src + lVar15 * 2 + lVar17);
          auVar39 = *(undefined1 (*) [16])(src + lVar15 * 3 + lVar17);
          auVar40 = *(undefined1 (*) [16])(src + lVar15 * 4 + lVar17);
          auVar136._0_16_ =
               ZEXT116(0) * auVar38 + ZEXT116(1) * *(undefined1 (*) [16])(src + (lVar20 - lVar15));
          auVar136._16_16_ = ZEXT116(1) * auVar38;
          auVar96._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar96._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
          auVar119._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar74;
          auVar119._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
          auVar143._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar39;
          auVar143._16_16_ = ZEXT116(1) * auVar40;
          auVar150 = vpunpcklbw_avx2(auVar136,auVar96);
          auVar165 = vpunpcklbw_avx2(auVar119,auVar143);
          auVar51 = vpunpckhbw_avx2(auVar136,auVar96);
          auVar137 = vpunpckhbw_avx2(auVar119,auVar143);
          puVar32 = src;
          pauVar29 = local_758;
          for (lVar17 = 0; auVar124 = auVar137, auVar154 = auVar165, lVar17 < h; lVar17 = lVar17 + 2
              ) {
            auVar38 = *(undefined1 (*) [16])(puVar32 + lVar14);
            auVar74 = *(undefined1 (*) [16])(puVar32 + lVar22);
            auVar137 = vpmaddubsw_avx2(auVar150,local_440);
            auVar150 = vpmaddubsw_avx2(auVar154,local_420);
            auVar137 = vpaddw_avx2(auVar150,auVar137);
            auVar151._8_2_ = 0x20;
            auVar151._0_8_ = 0x20002000200020;
            auVar151._10_2_ = 0x20;
            auVar151._12_2_ = 0x20;
            auVar151._14_2_ = 0x20;
            auVar151._16_2_ = 0x20;
            auVar151._18_2_ = 0x20;
            auVar151._20_2_ = 0x20;
            auVar151._22_2_ = 0x20;
            auVar151._24_2_ = 0x20;
            auVar151._26_2_ = 0x20;
            auVar151._28_2_ = 0x20;
            auVar151._30_2_ = 0x20;
            auVar137 = vpaddw_avx2(auVar151,auVar137);
            auVar137 = vpsraw_avx2(auVar137,6);
            auVar137 = vpackuswb_avx2(auVar137,auVar137);
            if (lVar30 < 9) {
              if (lVar30 < 5) {
                if (lVar30 < 3) {
                  vpextrw_avx(auVar137._0_16_,0);
                  vpextrw_avx(auVar137._16_16_,0);
                }
                else {
                  *(int *)*pauVar29 = auVar137._0_4_;
                  *(int *)(*pauVar29 + lVar23) = auVar137._16_4_;
                }
              }
              else {
                *(long *)*pauVar29 = auVar137._0_8_;
                *(long *)(*pauVar29 + lVar23) = auVar137._16_8_;
              }
            }
            else {
              auVar51 = vpmaddubsw_avx2(auVar51,local_440);
              auVar150 = vpmaddubsw_avx2(auVar124,local_420);
              auVar51 = vpaddw_avx2(auVar51,auVar150);
              auVar51 = vpaddw_avx2(auVar51,auVar151);
              auVar51 = vpsraw_avx2(auVar51,6);
              auVar51 = vpackuswb_avx2(auVar51,local_440);
              auVar51 = vpunpcklqdq_avx2(auVar137,auVar51);
              *pauVar29 = auVar51._0_16_;
              *(undefined1 (*) [16])(*pauVar29 + lVar23) = auVar51._16_16_;
            }
            auVar120._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar40;
            auVar120._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
            auVar138._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
            auVar138._16_16_ = ZEXT116(1) * auVar74;
            auVar165 = vpunpcklbw_avx2(auVar120,auVar138);
            auVar137 = vpunpckhbw_avx2(auVar120,auVar138);
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar23 * 2);
            puVar32 = puVar32 + lVar15 * 2;
            auVar150 = auVar154;
            auVar51 = auVar124;
            auVar40 = auVar74;
          }
          local_758 = local_758 + 1;
          lVar22 = lVar22 + 0x10;
          lVar14 = lVar14 + 0x10;
        }
      }
      else {
        lVar14 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
        lVar15 = (long)src_stride;
        lVar20 = (long)dst_stride;
        lVar23 = (src_stride << 3) - lVar14;
        lVar22 = src_stride * 7 - lVar14;
        for (lVar30 = 0; lVar17 = w - lVar30, lVar30 < w; lVar30 = lVar30 + 0x10) {
          lVar24 = lVar30 - lVar14;
          auVar38 = *(undefined1 (*) [16])(src + lVar15 + lVar24);
          auVar74 = *(undefined1 (*) [16])(src + lVar15 * 2 + lVar24);
          auVar39 = *(undefined1 (*) [16])(src + lVar15 * 3 + lVar24);
          auVar40 = *(undefined1 (*) [16])(src + lVar15 * 4 + lVar24);
          auVar103 = *(undefined1 (*) [16])(src + lVar15 * 5 + lVar24);
          auVar108._0_16_ =
               ZEXT116(0) * auVar38 + ZEXT116(1) * *(undefined1 (*) [16])(src + (lVar30 - lVar14));
          auVar108._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar121._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar121._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
          auVar160._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar74;
          auVar160._16_16_ = ZEXT116(1) * auVar39;
          auVar168._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar39;
          auVar168._16_16_ = ZEXT116(1) * auVar40;
          auVar144._0_16_ = ZEXT116(0) * auVar103 + ZEXT116(1) * auVar40;
          auVar144._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
          auVar38 = *(undefined1 (*) [16])(src + lVar15 * 6 + lVar24);
          auVar74 = local_460._0_16_;
          auVar167._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar167._32_32_ = in_ZMM10._32_32_;
          auVar167._16_16_ = ZEXT116(1) * auVar74;
          auVar152._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar103;
          auVar152._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar165 = vpunpcklbw_avx2(auVar108,auVar121);
          auVar124 = vpunpcklbw_avx2(auVar160,auVar168);
          auVar154 = vpunpcklbw_avx2(auVar144,auVar152);
          auVar51 = vpunpckhbw_avx2(auVar108,auVar121);
          auVar137 = vpunpckhbw_avx2(auVar160,auVar168);
          auVar150 = vpunpckhbw_avx2(auVar144,auVar152);
          puVar32 = src;
          pauVar29 = local_758;
          for (lVar24 = 0; auVar88 = auVar124, lVar24 < h; lVar24 = lVar24 + 2) {
            auVar38 = *(undefined1 (*) [16])(puVar32 + lVar22);
            auVar145._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar167._0_16_;
            auVar145._16_16_ = ZEXT116(0) * auVar167._16_16_ + ZEXT116(1) * auVar38;
            auVar39 = *(undefined1 (*) [16])(puVar32 + lVar23);
            auVar164._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar38;
            auVar164._16_16_ = ZEXT116(1) * auVar39;
            auVar131 = vpunpcklbw_avx2(auVar145,auVar164);
            auVar133 = vpunpckhbw_avx2(auVar145,auVar164);
            auVar165 = vpmaddubsw_avx2(auVar165,(undefined1  [32])local_460);
            auVar124 = vpmaddubsw_avx2(auVar88,local_440);
            auVar165 = vpaddw_avx2(auVar165,auVar124);
            auVar124 = vpmaddubsw_avx2(auVar154,local_420);
            auVar165 = vpaddw_avx2(auVar165,auVar124);
            auVar124 = vpmaddubsw_avx2(auVar131,local_400);
            auVar169._8_2_ = 0x20;
            auVar169._0_8_ = 0x20002000200020;
            auVar169._10_2_ = 0x20;
            auVar169._12_2_ = 0x20;
            auVar169._14_2_ = 0x20;
            auVar169._16_2_ = 0x20;
            auVar169._18_2_ = 0x20;
            auVar169._20_2_ = 0x20;
            auVar169._22_2_ = 0x20;
            auVar169._24_2_ = 0x20;
            auVar169._26_2_ = 0x20;
            auVar169._28_2_ = 0x20;
            auVar169._30_2_ = 0x20;
            auVar165 = vpaddw_avx2(auVar165,auVar169);
            auVar165 = vpaddw_avx2(auVar165,auVar124);
            auVar165 = vpsraw_avx2(auVar165,6);
            auVar165 = vpackuswb_avx2(auVar165,auVar165);
            if (lVar17 < 9) {
              if (lVar17 < 5) {
                if (lVar17 < 3) {
                  vpextrw_avx(auVar165._0_16_,0);
                  vpextrw_avx(auVar165._16_16_,0);
                }
                else {
                  *(int *)*pauVar29 = auVar165._0_4_;
                  *(int *)(*pauVar29 + lVar20) = auVar165._16_4_;
                }
              }
              else {
                *(long *)*pauVar29 = auVar165._0_8_;
                *(long *)(*pauVar29 + lVar20) = auVar165._16_8_;
              }
            }
            else {
              auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_460);
              auVar124 = vpmaddubsw_avx2(auVar137,local_440);
              auVar51 = vpaddw_avx2(auVar51,auVar124);
              auVar124 = vpmaddubsw_avx2(auVar150,local_420);
              auVar51 = vpaddw_avx2(auVar51,auVar124);
              auVar124 = vpmaddubsw_avx2(auVar133,local_400);
              auVar51 = vpaddw_avx2(auVar51,auVar169);
              auVar51 = vpaddw_avx2(auVar51,auVar124);
              auVar51 = vpsraw_avx2(auVar51,6);
              auVar51 = vpackuswb_avx2(auVar51,(undefined1  [32])local_460);
              auVar51 = vpunpcklqdq_avx2(auVar165,auVar51);
              *pauVar29 = auVar51._0_16_;
              *(undefined1 (*) [16])(*pauVar29 + lVar20) = auVar51._16_16_;
            }
            auVar167 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                           ZEXT116(1) * auVar74,
                                           ZEXT116(0) * auVar74 + ZEXT116(1) * auVar39));
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar20 * 2);
            puVar32 = puVar32 + lVar15 * 2;
            auVar124 = auVar154;
            auVar51 = auVar137;
            auVar137 = auVar150;
            auVar165 = auVar88;
            auVar154 = auVar131;
            auVar150 = auVar133;
          }
          local_758 = local_758 + 1;
          lVar23 = lVar23 + 0x10;
          lVar22 = lVar22 + 0x10;
          in_ZMM10 = auVar167;
        }
      }
    }
  }
  else {
    switch(iVar13) {
    case 2:
      if (subpel_y_qn == 8) {
        if (w < 9) {
          if (w == 4) {
            uVar16 = *(uint *)src;
            do {
              uVar1 = *(uint *)(src + src_stride);
              auVar38 = vpavgb_avx(ZEXT416(uVar16),ZEXT416(uVar1));
              *(int *)dst = auVar38._0_4_;
              uVar16 = *(uint *)(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar38 = vpavgb_avx(ZEXT416(uVar1),ZEXT416(uVar16));
              *(int *)(dst + dst_stride) = auVar38._0_4_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 2) {
            uVar16 = (uint)*(short *)src;
            do {
              auVar38 = vpavgb_avx(ZEXT416(uVar16),ZEXT416((uint)(int)*(short *)(src + src_stride)))
              ;
              vpextrw_avx(auVar38,0);
              uVar16 = (uint)*(short *)(src + src_stride * 2);
              auVar38 = vpavgb_avx(ZEXT416((uint)(int)*(short *)(src + src_stride)),ZEXT416(uVar16))
              ;
              vpextrw_avx(auVar38,0);
              src = src + src_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            uVar18 = *(ulong *)src;
            do {
              auVar46._8_8_ = 0;
              auVar46._0_8_ = uVar18;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(src + src_stride);
              auVar38 = vpavgb_avx(auVar46,auVar60);
              *(long *)dst = auVar38._0_8_;
              uVar18 = *(ulong *)(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = uVar18;
              auVar38 = vpavgb_avx(auVar60,auVar47);
              *(long *)(dst + dst_stride) = auVar38._0_8_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
        }
        else if (w == 0x40) {
          auVar137 = *(undefined1 (*) [32])src;
          auVar51 = *(undefined1 (*) [32])(src + 0x20);
          puVar32 = src + 0x20;
          lVar14 = (long)src_stride;
          lVar15 = lVar14 * 2;
          pauVar25 = (undefined1 (*) [32])(dst + 0x20);
          do {
            auVar150 = *(undefined1 (*) [32])(puVar32 + lVar14 + -0x20);
            auVar137 = vpavgb_avx2(auVar137,auVar150);
            pauVar25[-1] = auVar137;
            auVar165 = *(undefined1 (*) [32])(puVar32 + lVar14);
            auVar51 = vpavgb_avx2(auVar51,auVar165);
            *pauVar25 = auVar51;
            auVar137 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x20);
            auVar51 = vpavgb_avx2(auVar150,auVar137);
            *(undefined1 (*) [32])(pauVar25[-1] + dst_stride) = auVar51;
            auVar51 = *(undefined1 (*) [32])(puVar32 + lVar15);
            puVar32 = puVar32 + lVar15;
            auVar150 = vpavgb_avx2(auVar165,auVar51);
            *(undefined1 (*) [32])(*pauVar25 + dst_stride) = auVar150;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x20) {
          auVar51 = *(undefined1 (*) [32])src;
          do {
            auVar137 = *(undefined1 (*) [32])(src + src_stride);
            auVar51 = vpavgb_avx2(auVar51,auVar137);
            *(undefined1 (*) [32])dst = auVar51;
            auVar51 = *(undefined1 (*) [32])(src + src_stride * 2);
            src = src + src_stride * 2;
            auVar137 = vpavgb_avx2(auVar137,auVar51);
            *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar137;
            dst = *(undefined1 (*) [32])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar38 = *(undefined1 (*) [16])src;
          do {
            auVar74 = *(undefined1 (*) [16])(src + src_stride);
            auVar38 = vpavgb_avx(auVar38,auVar74);
            *(undefined1 (*) [16])dst = auVar38;
            auVar38 = *(undefined1 (*) [16])(src + src_stride * 2);
            src = src + src_stride * 2;
            auVar74 = vpavgb_avx(auVar74,auVar38);
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar74;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar150 = *(undefined1 (*) [32])src;
          auVar165 = *(undefined1 (*) [32])(src + 0x20);
          auVar137 = *(undefined1 (*) [32])(src + 0x40);
          auVar51 = *(undefined1 (*) [32])(src + 0x60);
          puVar32 = src + 0x60;
          lVar14 = (long)src_stride;
          lVar15 = lVar14 * 2;
          pauVar25 = (undefined1 (*) [32])(dst + 0x60);
          do {
            auVar124 = *(undefined1 (*) [32])(puVar32 + lVar14 + -0x60);
            auVar150 = vpavgb_avx2(auVar150,auVar124);
            pauVar25[-3] = auVar150;
            auVar154 = *(undefined1 (*) [32])(puVar32 + lVar14 + -0x40);
            auVar150 = vpavgb_avx2(auVar165,auVar154);
            pauVar25[-2] = auVar150;
            auVar88 = *(undefined1 (*) [32])(puVar32 + lVar14 + -0x20);
            auVar137 = vpavgb_avx2(auVar137,auVar88);
            pauVar25[-1] = auVar137;
            auVar133 = *(undefined1 (*) [32])(puVar32 + lVar14);
            auVar51 = vpavgb_avx2(auVar51,auVar133);
            *pauVar25 = auVar51;
            auVar150 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x60);
            auVar51 = vpavgb_avx2(auVar124,auVar150);
            *(undefined1 (*) [32])(pauVar25[-3] + dst_stride) = auVar51;
            auVar165 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x40);
            auVar51 = vpavgb_avx2(auVar154,auVar165);
            *(undefined1 (*) [32])(pauVar25[-2] + dst_stride) = auVar51;
            auVar137 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x20);
            auVar51 = vpavgb_avx2(auVar88,auVar137);
            *(undefined1 (*) [32])(pauVar25[-1] + dst_stride) = auVar51;
            auVar51 = *(undefined1 (*) [32])(puVar32 + lVar15);
            puVar32 = puVar32 + lVar15;
            auVar124 = vpavgb_avx2(auVar133,auVar51);
            *(undefined1 (*) [32])(*pauVar25 + dst_stride) = auVar124;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + dst_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
      }
      else {
        stride_01 = filter_params_y->filter_ptr;
        if (w < 9) {
          auVar38 = vpsrlw_avx(ZEXT416(*(uint *)(stride_01 +
                                                (ulong)((uint)filter_params_y->taps *
                                                       (subpel_y_qn & 0xfU)) + 3)),1);
          auVar38 = vpshufb_avx(auVar38,_DAT_0046d970);
          if (w == 4) {
            uVar16 = *(uint *)src;
            lVar15 = (long)src_stride;
            local_740._8_2_ = 0x20;
            local_740._0_8_ = 0x20002000200020;
            local_740._10_2_ = 0x20;
            local_740._12_2_ = 0x20;
            local_740._14_2_ = 0x20;
            puVar32 = extraout_RDX;
            do {
              auVar74 = vpinsrd_avx(ZEXT416(uVar16),*(uint *)(src + lVar15),1);
              uVar16 = *(uint *)(src + lVar15 * 2);
              auVar39 = vpinsrd_avx(ZEXT416(*(uint *)(src + lVar15)),
                                    *(undefined4 *)(src + lVar15 * 2),1);
              auVar74 = vpunpcklbw_avx(auVar74,auVar39);
              auVar74 = vpmaddubsw_avx(auVar74,auVar38);
              auVar74 = vpaddw_avx(auVar74,local_740._0_16_);
              vpsraw_avx(auVar74,6);
              res_02[1] = (long)dst_stride;
              res_02[0] = (longlong)dst;
              pack_store_4x2_sse2(res_02,puVar32,(ptrdiff_t)stride_01);
              src = src + src_stride * 2;
              dst = dst + dst_stride * 2;
              h = h + -2;
              puVar32 = extraout_RDX_03;
            } while (h != 0);
          }
          else if (w == 2) {
            uVar16 = (uint)*(short *)src;
            auVar59._8_2_ = 0x20;
            auVar59._0_8_ = 0x20002000200020;
            auVar59._10_2_ = 0x20;
            auVar59._12_2_ = 0x20;
            auVar59._14_2_ = 0x20;
            do {
              auVar74 = vpunpcklwd_avx(ZEXT416(uVar16),
                                       ZEXT416((uint)(int)*(short *)(src + src_stride)));
              uVar16 = (uint)*(short *)(src + (long)src_stride * 2);
              auVar39 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(src + src_stride)),
                                       ZEXT416(uVar16));
              auVar74 = vpunpcklbw_avx(auVar74,auVar39);
              auVar74 = vpmaddubsw_avx(auVar74,auVar38);
              auVar74 = vpaddw_avx(auVar74,auVar59);
              auVar74 = vpsraw_avx(auVar74,6);
              auVar74 = vpackuswb_avx(auVar74,auVar74);
              vpextrw_avx(auVar74,0);
              vpextrw_avx(auVar74,1);
              src = src + src_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            uVar18 = *(ulong *)src;
            iVar13 = src_stride * 2;
            auVar48._8_2_ = 0x20;
            auVar48._0_8_ = 0x20002000200020;
            auVar48._10_2_ = 0x20;
            auVar48._12_2_ = 0x20;
            auVar48._14_2_ = 0x20;
            do {
              auVar61._8_8_ = 0;
              auVar61._0_8_ = uVar18;
              auVar74 = vpinsrq_avx(auVar61,*(ulong *)(src + src_stride),1);
              auVar94._8_8_ = 0;
              auVar94._0_8_ = *(ulong *)(src + src_stride);
              auVar40 = vpunpcklbw_avx(auVar61,auVar94);
              uVar18 = *(ulong *)(src + iVar13);
              auVar105._8_8_ = *(undefined8 *)(src + iVar13);
              auVar105._0_8_ = *(undefined8 *)(src + iVar13);
              src = src + iVar13;
              auVar39 = vpunpckhbw_avx(auVar74,auVar105);
              auVar74 = vpmaddubsw_avx(auVar40,auVar38);
              auVar39 = vpmaddubsw_avx(auVar39,auVar38);
              auVar74 = vpaddw_avx(auVar74,auVar48);
              auVar74 = vpsraw_avx(auVar74,6);
              auVar74 = vpackuswb_avx(auVar74,auVar74);
              auVar39 = vpaddw_avx(auVar39,auVar48);
              auVar39 = vpsraw_avx(auVar39,6);
              auVar39 = vpackuswb_avx(auVar39,auVar39);
              *(long *)dst = auVar74._0_8_;
              *(long *)(dst + dst_stride) = auVar39._0_8_;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
        }
        else {
          auVar38 = ZEXT416(*(uint *)(stride_01 +
                                     (ulong)((uint)filter_params_y->taps * (subpel_y_qn & 0xfU)) + 3
                                     ));
          auVar52._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar38;
          auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar51 = vpsrlw_avx2(auVar52,1);
          auVar51 = vpshufb_avx2(auVar51,_DAT_004c2140);
          if (w == 0x40) {
            auVar137 = *(undefined1 (*) [32])src;
            auVar150 = *(undefined1 (*) [32])(src + 0x20);
            puVar32 = src + 0x20;
            lVar15 = (long)(src_stride * 2);
            pauVar25 = (undefined1 (*) [32])(dst + 0x20);
            auVar68._8_2_ = 0x20;
            auVar68._0_8_ = 0x20002000200020;
            auVar68._10_2_ = 0x20;
            auVar68._12_2_ = 0x20;
            auVar68._14_2_ = 0x20;
            auVar68._16_2_ = 0x20;
            auVar68._18_2_ = 0x20;
            auVar68._20_2_ = 0x20;
            auVar68._22_2_ = 0x20;
            auVar68._24_2_ = 0x20;
            auVar68._26_2_ = 0x20;
            auVar68._28_2_ = 0x20;
            auVar68._30_2_ = 0x20;
            do {
              auVar165 = *(undefined1 (*) [32])(puVar32 + (long)src_stride + -0x20);
              auVar154 = vpunpcklbw_avx2(auVar137,auVar165);
              auVar124 = vpunpckhbw_avx2(auVar137,auVar165);
              auVar137 = vpmaddubsw_avx2(auVar154,auVar51);
              auVar124 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar68);
              auVar154 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar124,auVar68);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar154,auVar137);
              pauVar25[-1] = auVar137;
              auVar124 = *(undefined1 (*) [32])(puVar32 + src_stride);
              auVar137 = vpunpcklbw_avx2(auVar150,auVar124);
              auVar150 = vpunpckhbw_avx2(auVar150,auVar124);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar68);
              auVar154 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar150,auVar68);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar154,auVar137);
              *pauVar25 = auVar137;
              auVar137 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x20);
              auVar150 = vpunpcklbw_avx2(auVar165,auVar137);
              auVar165 = vpunpckhbw_avx2(auVar165,auVar137);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar150 = vpaddw_avx2(auVar150,auVar68);
              auVar154 = vpsraw_avx2(auVar150,6);
              auVar150 = vpaddw_avx2(auVar165,auVar68);
              auVar150 = vpsraw_avx2(auVar150,6);
              auVar150 = vpackuswb_avx2(auVar154,auVar150);
              *(undefined1 (*) [32])(pauVar25[-1] + dst_stride) = auVar150;
              auVar150 = *(undefined1 (*) [32])(puVar32 + lVar15);
              puVar32 = puVar32 + lVar15;
              auVar165 = vpunpcklbw_avx2(auVar124,auVar150);
              auVar124 = vpunpckhbw_avx2(auVar124,auVar150);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar124 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar165 = vpaddw_avx2(auVar165,auVar68);
              auVar154 = vpsraw_avx2(auVar165,6);
              auVar165 = vpaddw_avx2(auVar124,auVar68);
              auVar165 = vpsraw_avx2(auVar165,6);
              auVar165 = vpackuswb_avx2(auVar154,auVar165);
              *(undefined1 (*) [32])(*pauVar25 + dst_stride) = auVar165;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x20) {
            auVar137 = *(undefined1 (*) [32])src;
            auVar67._8_2_ = 0x20;
            auVar67._0_8_ = 0x20002000200020;
            auVar67._10_2_ = 0x20;
            auVar67._12_2_ = 0x20;
            auVar67._14_2_ = 0x20;
            auVar67._16_2_ = 0x20;
            auVar67._18_2_ = 0x20;
            auVar67._20_2_ = 0x20;
            auVar67._22_2_ = 0x20;
            auVar67._24_2_ = 0x20;
            auVar67._26_2_ = 0x20;
            auVar67._28_2_ = 0x20;
            auVar67._30_2_ = 0x20;
            do {
              auVar150 = *(undefined1 (*) [32])(src + src_stride);
              auVar124 = vpunpcklbw_avx2(auVar137,auVar150);
              auVar165 = vpunpckhbw_avx2(auVar137,auVar150);
              auVar137 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar67);
              auVar124 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar165,auVar67);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar124,auVar137);
              *(undefined1 (*) [32])dst = auVar137;
              auVar137 = *(undefined1 (*) [32])(src + src_stride * 2);
              src = src + src_stride * 2;
              auVar124 = vpunpcklbw_avx2(auVar150,auVar137);
              auVar165 = vpunpckhbw_avx2(auVar150,auVar137);
              auVar150 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar150 = vpaddw_avx2(auVar150,auVar67);
              auVar124 = vpsraw_avx2(auVar150,6);
              auVar150 = vpaddw_avx2(auVar165,auVar67);
              auVar150 = vpsraw_avx2(auVar150,6);
              auVar150 = vpackuswb_avx2(auVar124,auVar150);
              *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar150;
              dst = *(undefined1 (*) [32])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar38 = *(undefined1 (*) [16])src;
            auVar85._8_2_ = 0x20;
            auVar85._0_8_ = 0x20002000200020;
            auVar85._10_2_ = 0x20;
            auVar85._12_2_ = 0x20;
            auVar85._14_2_ = 0x20;
            auVar85._16_2_ = 0x20;
            auVar85._18_2_ = 0x20;
            auVar85._20_2_ = 0x20;
            auVar85._22_2_ = 0x20;
            auVar85._24_2_ = 0x20;
            auVar85._26_2_ = 0x20;
            auVar85._28_2_ = 0x20;
            auVar85._30_2_ = 0x20;
            do {
              auVar74 = *(undefined1 (*) [16])(src + src_stride);
              auVar111._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
              auVar111._16_16_ = ZEXT116(1) * auVar74;
              auVar38 = *(undefined1 (*) [16])(src + (long)src_stride * 2);
              auVar99._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar74;
              auVar99._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38
              ;
              auVar137 = vpunpcklbw_avx2(auVar111,auVar99);
              auVar150 = vpunpckhbw_avx2(auVar111,auVar99);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar85);
              auVar165 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar150,auVar85);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar165,auVar137);
              *(undefined1 (*) [16])dst = auVar137._0_16_;
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar137._16_16_;
              src = src + src_stride * 2;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            auVar165 = *(undefined1 (*) [32])src;
            auVar124 = *(undefined1 (*) [32])(src + 0x20);
            auVar137 = *(undefined1 (*) [32])(src + 0x40);
            auVar150 = *(undefined1 (*) [32])(src + 0x60);
            puVar32 = src + 0x60;
            lVar15 = (long)(src_stride * 2);
            pauVar25 = (undefined1 (*) [32])(dst + 0x60);
            auVar69._8_2_ = 0x20;
            auVar69._0_8_ = 0x20002000200020;
            auVar69._10_2_ = 0x20;
            auVar69._12_2_ = 0x20;
            auVar69._14_2_ = 0x20;
            auVar69._16_2_ = 0x20;
            auVar69._18_2_ = 0x20;
            auVar69._20_2_ = 0x20;
            auVar69._22_2_ = 0x20;
            auVar69._24_2_ = 0x20;
            auVar69._26_2_ = 0x20;
            auVar69._28_2_ = 0x20;
            auVar69._30_2_ = 0x20;
            do {
              auVar154 = *(undefined1 (*) [32])(puVar32 + (long)src_stride + -0x60);
              auVar133 = vpunpcklbw_avx2(auVar165,auVar154);
              auVar88 = vpunpckhbw_avx2(auVar165,auVar154);
              auVar165 = vpmaddubsw_avx2(auVar133,auVar51);
              auVar88 = vpmaddubsw_avx2(auVar88,auVar51);
              auVar165 = vpaddw_avx2(auVar165,auVar69);
              auVar133 = vpsraw_avx2(auVar165,6);
              auVar165 = vpaddw_avx2(auVar88,auVar69);
              auVar165 = vpsraw_avx2(auVar165,6);
              auVar165 = vpackuswb_avx2(auVar133,auVar165);
              pauVar25[-3] = auVar165;
              auVar88 = *(undefined1 (*) [32])(puVar32 + (long)src_stride + -0x40);
              auVar165 = vpunpcklbw_avx2(auVar124,auVar88);
              auVar124 = vpunpckhbw_avx2(auVar124,auVar88);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar124 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar165 = vpaddw_avx2(auVar165,auVar69);
              auVar133 = vpsraw_avx2(auVar165,6);
              auVar165 = vpaddw_avx2(auVar124,auVar69);
              auVar165 = vpsraw_avx2(auVar165,6);
              auVar165 = vpackuswb_avx2(auVar133,auVar165);
              pauVar25[-2] = auVar165;
              auVar133 = *(undefined1 (*) [32])(puVar32 + (long)src_stride + -0x20);
              auVar124 = vpunpcklbw_avx2(auVar137,auVar133);
              auVar165 = vpunpckhbw_avx2(auVar137,auVar133);
              auVar137 = vpmaddubsw_avx2(auVar124,auVar51);
              auVar165 = vpmaddubsw_avx2(auVar165,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar69);
              auVar124 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar165,auVar69);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar124,auVar137);
              pauVar25[-1] = auVar137;
              auVar131 = *(undefined1 (*) [32])(puVar32 + src_stride);
              auVar137 = vpunpcklbw_avx2(auVar150,auVar131);
              auVar150 = vpunpckhbw_avx2(auVar150,auVar131);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar69);
              auVar165 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar150,auVar69);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar165,auVar137);
              *pauVar25 = auVar137;
              auVar165 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x60);
              auVar137 = vpunpcklbw_avx2(auVar154,auVar165);
              auVar150 = vpunpckhbw_avx2(auVar154,auVar165);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar69);
              auVar124 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar150,auVar69);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar124,auVar137);
              *(undefined1 (*) [32])(pauVar25[-3] + dst_stride) = auVar137;
              auVar124 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x40);
              auVar137 = vpunpcklbw_avx2(auVar88,auVar124);
              auVar150 = vpunpckhbw_avx2(auVar88,auVar124);
              auVar137 = vpmaddubsw_avx2(auVar137,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar137 = vpaddw_avx2(auVar137,auVar69);
              auVar154 = vpsraw_avx2(auVar137,6);
              auVar137 = vpaddw_avx2(auVar150,auVar69);
              auVar137 = vpsraw_avx2(auVar137,6);
              auVar137 = vpackuswb_avx2(auVar154,auVar137);
              *(undefined1 (*) [32])(pauVar25[-2] + dst_stride) = auVar137;
              auVar137 = *(undefined1 (*) [32])(puVar32 + lVar15 + -0x20);
              auVar150 = vpunpcklbw_avx2(auVar133,auVar137);
              auVar154 = vpunpckhbw_avx2(auVar133,auVar137);
              auVar150 = vpmaddubsw_avx2(auVar150,auVar51);
              auVar154 = vpmaddubsw_avx2(auVar154,auVar51);
              auVar150 = vpaddw_avx2(auVar150,auVar69);
              auVar88 = vpsraw_avx2(auVar150,6);
              auVar150 = vpaddw_avx2(auVar154,auVar69);
              auVar150 = vpsraw_avx2(auVar150,6);
              auVar150 = vpackuswb_avx2(auVar88,auVar150);
              *(undefined1 (*) [32])(pauVar25[-1] + dst_stride) = auVar150;
              auVar150 = *(undefined1 (*) [32])(puVar32 + lVar15);
              puVar32 = puVar32 + lVar15;
              auVar154 = vpunpcklbw_avx2(auVar131,auVar150);
              auVar88 = vpunpckhbw_avx2(auVar131,auVar150);
              auVar154 = vpmaddubsw_avx2(auVar154,auVar51);
              auVar88 = vpmaddubsw_avx2(auVar88,auVar51);
              auVar154 = vpaddw_avx2(auVar154,auVar69);
              auVar133 = vpsraw_avx2(auVar154,6);
              auVar154 = vpaddw_avx2(auVar88,auVar69);
              auVar154 = vpsraw_avx2(auVar154,6);
              auVar154 = vpackuswb_avx2(auVar133,auVar154);
              *(undefined1 (*) [32])(*pauVar25 + dst_stride) = auVar154;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + dst_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
        }
      }
      break;
    case 4:
      lVar15 = (long)src_stride;
      stride = (__m256i *)(src + -lVar15);
      auVar38 = vpsraw_avx(*(undefined1 (*) [16])
                            (filter_params_y->filter_ptr +
                            (uint)filter_params_y->taps * (subpel_y_qn & 0xfU)),1);
      if (w < 5) {
        auVar74 = vpshufb_avx(auVar38,_DAT_0046d980);
        auVar38 = vpshufb_avx(auVar38,_DAT_0046d990);
        if (w == 2) {
          uVar16 = (uint)*(short *)((long)*stride + lVar15 * 2);
          auVar39 = vpunpcklwd_avx(ZEXT416((uint)(int)(short)(*stride)[0]),
                                   ZEXT416((uint)(int)*(short *)src));
          auVar40 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),ZEXT416(uVar16));
          auVar39 = vpunpcklbw_avx(auVar39,auVar40);
          psVar27 = (short *)(src + lVar15 * 2);
          auVar56._8_2_ = 0x20;
          auVar56._0_8_ = 0x20002000200020;
          auVar56._10_2_ = 0x20;
          auVar56._12_2_ = 0x20;
          auVar56._14_2_ = 0x20;
          do {
            auVar103 = vpunpcklwd_avx(ZEXT416(uVar16),ZEXT416((uint)(int)*psVar27));
            uVar16 = (uint)*(short *)((long)psVar27 + lVar15);
            auVar92 = vpunpcklwd_avx(ZEXT416((uint)(int)*psVar27),ZEXT416(uVar16));
            auVar40 = vpmaddubsw_avx(auVar39,auVar74);
            auVar39 = vpunpcklbw_avx(auVar103,auVar92);
            auVar40 = vpaddw_avx(auVar40,auVar56);
            auVar103 = vpmaddubsw_avx(auVar39,auVar38);
            auVar40 = vpaddw_avx(auVar40,auVar103);
            auVar40 = vpsraw_avx(auVar40,6);
            auVar40 = vpackuswb_avx(auVar40,auVar40);
            vpextrw_avx(auVar40,0);
            vpextrw_avx(auVar40,1);
            psVar27 = psVar27 + lVar15;
            h = h + -2;
          } while (h != 0);
        }
        else {
          auVar39 = vpinsrd_avx(ZEXT416((uint)(*stride)[0]),*(uint *)src,1);
          auVar40 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)*stride + lVar15 * 2),1)
          ;
          uVar16 = *(uint *)((long)*stride + lVar15 * 2);
          auVar39 = vpunpcklbw_avx(auVar39,auVar40);
          puVar28 = (uint *)(src + lVar15 * 2);
          local_6c0._8_2_ = 0x20;
          local_6c0._0_8_ = 0x20002000200020;
          local_6c0._10_2_ = 0x20;
          local_6c0._12_2_ = 0x20;
          local_6c0._14_2_ = 0x20;
          puVar32 = (uint8_t *)(lVar15 * 2);
          do {
            auVar40 = vpinsrd_avx(ZEXT416(uVar16),*puVar28,1);
            uVar16 = *(uint *)((long)puVar28 + lVar15);
            auVar103 = vpinsrd_avx(ZEXT416(*puVar28),*(undefined4 *)((long)puVar28 + lVar15),1);
            auVar103 = vpunpcklbw_avx(auVar40,auVar103);
            auVar39 = vpmaddubsw_avx(auVar39,auVar74);
            auVar39 = vpaddw_avx(auVar39,local_6c0._0_16_);
            auVar40 = vpmaddubsw_avx(auVar103,auVar38);
            auVar39 = vpaddw_avx(auVar39,auVar40);
            vpsraw_avx(auVar39,6);
            res_00[1] = (long)dst_stride;
            res_00[0] = (longlong)dst;
            pack_store_4x2_sse2(res_00,puVar32,(ptrdiff_t)stride);
            dst = dst + dst_stride * 2;
            puVar28 = (uint *)((long)puVar28 + lVar15 * 2);
            h = h + -2;
            puVar32 = extraout_RDX_01;
            auVar39 = auVar103;
          } while (h != 0);
        }
      }
      else {
        auVar74 = vpshufb_avx(auVar38,_DAT_004c21e0);
        local_3a0[0]._0_2_ = auVar74._0_2_;
        local_3a0[0]._2_2_ = (undefined2)local_3a0[0];
        local_3a0[0]._4_2_ = (undefined2)local_3a0[0];
        local_3a0[0]._6_2_ = (undefined2)local_3a0[0];
        local_3a0[1]._0_2_ = (undefined2)local_3a0[0];
        local_3a0[1]._2_2_ = (undefined2)local_3a0[0];
        local_3a0[1]._4_2_ = (undefined2)local_3a0[0];
        local_3a0[1]._6_2_ = (undefined2)local_3a0[0];
        local_3a0[2]._0_2_ = (undefined2)local_3a0[0];
        local_3a0[2]._2_2_ = (undefined2)local_3a0[0];
        local_3a0[2]._4_2_ = (undefined2)local_3a0[0];
        local_3a0[2]._6_2_ = (undefined2)local_3a0[0];
        local_3a0[3]._0_2_ = (undefined2)local_3a0[0];
        local_3a0[3]._2_2_ = (undefined2)local_3a0[0];
        local_3a0[3]._4_2_ = (undefined2)local_3a0[0];
        local_3a0[3]._6_2_ = (undefined2)local_3a0[0];
        auVar38 = vpshufb_avx(auVar38,_DAT_004c21f0);
        local_380[0]._0_2_ = auVar38._0_2_;
        local_380[0]._2_2_ = (undefined2)local_380[0];
        local_380[0]._4_2_ = (undefined2)local_380[0];
        local_380[0]._6_2_ = (undefined2)local_380[0];
        local_380[1]._0_2_ = (undefined2)local_380[0];
        local_380[1]._2_2_ = (undefined2)local_380[0];
        local_380[1]._4_2_ = (undefined2)local_380[0];
        local_380[1]._6_2_ = (undefined2)local_380[0];
        local_380[2]._0_2_ = (undefined2)local_380[0];
        local_380[2]._2_2_ = (undefined2)local_380[0];
        local_380[2]._4_2_ = (undefined2)local_380[0];
        local_380[2]._6_2_ = (undefined2)local_380[0];
        local_380[3]._0_2_ = (undefined2)local_380[0];
        local_380[3]._2_2_ = (undefined2)local_380[0];
        local_380[3]._4_2_ = (undefined2)local_380[0];
        local_380[3]._6_2_ = (undefined2)local_380[0];
        if (w == 0x20) {
          local_460 = *stride;
          local_440 = *(undefined1 (*) [32])src;
          local_420 = *(undefined1 (*) [32])((long)*stride + lVar15 * 2);
          local_160 = (__m256i)vpunpcklbw_avx2((undefined1  [32])local_460,local_440);
          local_120 = vpunpckhbw_avx2((undefined1  [32])local_460,local_440);
          local_1e0 = (__m256i)vpunpcklbw_avx2(local_440,local_420);
          local_1a0 = vpunpckhbw_avx2(local_440,local_420);
          puVar32 = src + lVar15;
          do {
            y_convolve_4tap_32x2_avx2
                      (puVar32,lVar15,&local_3a0,&local_460,&local_160,&local_1e0,
                       (__m256i *)local_e0);
            sr_y_round_store_32x2_avx2((__m256i *)local_e0,dst,dst_stride);
            local_160[1] = uStack_138;
            local_160[0] = local_140;
            local_160[2] = uStack_130;
            local_160[3] = lStack_128;
            local_120._8_8_ = uStack_f8;
            local_120._0_8_ = local_100;
            local_120._16_8_ = uStack_f0;
            local_120._24_8_ = uStack_e8;
            local_1e0[1] = uStack_1b8;
            local_1e0[0] = local_1c0;
            local_1e0[2] = uStack_1b0;
            local_1e0[3] = lStack_1a8;
            local_1a0._8_8_ = uStack_178;
            local_1a0._0_8_ = local_180;
            local_1a0._16_8_ = uStack_170;
            local_1a0._24_8_ = uStack_168;
            dst = dst + dst_stride * 2;
            puVar32 = puVar32 + lVar15 * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar38 = *(undefined1 (*) [16])src;
          auVar74 = *(undefined1 (*) [16])((long)*stride + lVar15 * 2);
          auVar101._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * *(undefined1 (*) [16])*stride;
          auVar101._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar114._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar114._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
          auVar137 = vpunpcklbw_avx2(auVar101,auVar114);
          auVar51 = vpunpckhbw_avx2(auVar101,auVar114);
          pauVar29 = (undefined1 (*) [16])(src + lVar15 * 2);
          auVar102._8_2_ = 0x20;
          auVar102._0_8_ = 0x20002000200020;
          auVar102._10_2_ = 0x20;
          auVar102._12_2_ = 0x20;
          auVar102._14_2_ = 0x20;
          auVar102._16_2_ = 0x20;
          auVar102._18_2_ = 0x20;
          auVar102._20_2_ = 0x20;
          auVar102._22_2_ = 0x20;
          auVar102._24_2_ = 0x20;
          auVar102._26_2_ = 0x20;
          auVar102._28_2_ = 0x20;
          auVar102._30_2_ = 0x20;
          do {
            auVar38 = *pauVar29;
            auVar140._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar74;
            auVar140._16_16_ = ZEXT116(1) * auVar38;
            auVar74 = *(undefined1 (*) [16])(*pauVar29 + lVar15);
            auVar132._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
            auVar132._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
            auVar150 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_3a0);
            auVar137 = vpunpcklbw_avx2(auVar140,auVar132);
            auVar165 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar51 = vpunpckhbw_avx2(auVar140,auVar132);
            auVar124 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
            auVar154 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_380);
            auVar150 = vpaddw_avx2(auVar150,auVar102);
            auVar150 = vpaddw_avx2(auVar150,auVar124);
            auVar124 = vpsraw_avx2(auVar150,6);
            auVar150 = vpaddw_avx2(auVar165,auVar102);
            auVar150 = vpaddw_avx2(auVar154,auVar150);
            auVar150 = vpsraw_avx2(auVar150,6);
            auVar150 = vpackuswb_avx2(auVar124,auVar150);
            *(undefined1 (*) [16])dst = auVar150._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar150._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 8) {
          uVar18 = *(ulong *)((long)*stride + lVar15 * 2);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)src;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = (*stride)[0];
          auVar97._0_16_ = ZEXT116(0) * auVar104 + ZEXT116(1) * auVar91;
          auVar97._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar104;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar18;
          auVar110._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar104;
          auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75;
          auVar51 = vpunpcklbw_avx2(auVar97,auVar110);
          puVar26 = (ulong *)(src + lVar15 * 2);
          auVar98._8_2_ = 0x20;
          auVar98._0_8_ = 0x20002000200020;
          auVar98._10_2_ = 0x20;
          auVar98._12_2_ = 0x20;
          auVar98._14_2_ = 0x20;
          auVar98._16_2_ = 0x20;
          auVar98._18_2_ = 0x20;
          auVar98._20_2_ = 0x20;
          auVar98._22_2_ = 0x20;
          auVar98._24_2_ = 0x20;
          auVar98._26_2_ = 0x20;
          auVar98._28_2_ = 0x20;
          auVar98._30_2_ = 0x20;
          do {
            auVar116._8_8_ = 0;
            auVar116._0_8_ = *puVar26;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar18;
            auVar129._0_16_ = ZEXT116(0) * auVar116 + ZEXT116(1) * auVar76;
            auVar129._16_16_ = ZEXT116(1) * auVar116;
            uVar18 = *(ulong *)((long)puVar26 + lVar15);
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uVar18;
            auVar122._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar116;
            auVar122._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar77;
            auVar137 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar51 = vpunpcklbw_avx2(auVar129,auVar122);
            auVar137 = vpaddw_avx2(auVar137,auVar98);
            auVar150 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_380);
            auVar137 = vpaddw_avx2(auVar137,auVar150);
            auVar137 = vpsraw_avx2(auVar137,6);
            auVar137 = vpackuswb_avx2(auVar137,(undefined1  [32])local_3a0);
            *(long *)dst = auVar137._0_8_;
            *(long *)(dst + dst_stride) = auVar137._16_8_;
            dst = dst + dst_stride * 2;
            puVar26 = (ulong *)((long)puVar26 + lVar15 * 2);
            h = h + -2;
          } while (h != 0);
        }
        else {
          puVar32 = src + lVar15;
          uVar18 = 0;
          do {
            puVar31 = dst + uVar18;
            local_460 = *(__m256i *)((long)*stride + uVar18);
            local_440 = *(undefined1 (*) [32])((long)*stride + lVar15 + uVar18);
            local_420 = *(undefined1 (*) [32])((long)*stride + lVar15 * 2 + uVar18);
            local_160 = (__m256i)vpunpcklbw_avx2((undefined1  [32])local_460,local_440);
            local_120 = vpunpckhbw_avx2((undefined1  [32])local_460,local_440);
            local_1e0 = (__m256i)vpunpcklbw_avx2(local_440,local_420);
            local_1a0 = vpunpckhbw_avx2(local_440,local_420);
            puVar21 = puVar32;
            iVar19 = h;
            do {
              y_convolve_4tap_32x2_avx2
                        (puVar21,lVar15,&local_3a0,&local_460,&local_160,&local_1e0,
                         (__m256i *)local_e0);
              sr_y_round_store_32x2_avx2((__m256i *)local_e0,puVar31,dst_stride);
              local_160[1] = uStack_138;
              local_160[0] = local_140;
              local_160[2] = uStack_130;
              local_160[3] = lStack_128;
              local_120._8_8_ = uStack_f8;
              local_120._0_8_ = local_100;
              local_120._16_8_ = uStack_f0;
              local_120._24_8_ = uStack_e8;
              local_1e0[1] = uStack_1b8;
              local_1e0[0] = local_1c0;
              local_1e0[2] = uStack_1b0;
              local_1e0[3] = lStack_1a8;
              local_1a0._8_8_ = uStack_178;
              local_1a0._0_8_ = local_180;
              local_1a0._16_8_ = uStack_170;
              local_1a0._24_8_ = uStack_168;
              puVar31 = puVar31 + dst_stride * 2;
              puVar21 = puVar21 + lVar15 * 2;
              iVar19 = iVar19 + -2;
            } while (iVar19 != 0);
            uVar18 = uVar18 + 0x20;
            puVar32 = puVar32 + 0x20;
          } while (uVar18 < (uint)w);
        }
      }
      break;
    case 6:
      lVar15 = (long)(src_stride * 2);
      pauVar29 = (undefined1 (*) [16])(src + -lVar15);
      if (w < 5) {
        auVar39 = vpsraw_avx(*(undefined1 (*) [16])
                              (filter_params_y->filter_ptr +
                              (uint)filter_params_y->taps * (subpel_y_qn & 0xfU)),1);
        auVar38 = vpshufb_avx(auVar39,_DAT_004c0060);
        auVar74 = vpshufb_avx(auVar39,_DAT_004c0070);
        auVar39 = vpshufb_avx(auVar39,_DAT_004c0080);
        if (w == 2) {
          lVar14 = (long)src_stride;
          uVar16 = (uint)*(short *)(*pauVar29 + lVar14 * 4);
          auVar40 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar29),
                                   ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar14)));
          auVar103 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar14)),
                                    ZEXT416((uint)(int)*(short *)src));
          auVar40 = vpunpcklbw_avx(auVar40,auVar103);
          auVar103 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                    ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar14 * 3)));
          auVar92 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar14 * 3)),
                                   ZEXT416(uVar16));
          auVar103 = vpunpcklbw_avx(auVar103,auVar92);
          auVar71._8_2_ = 0x20;
          auVar71._0_8_ = 0x20002000200020;
          auVar71._10_2_ = 0x20;
          auVar71._12_2_ = 0x20;
          auVar71._14_2_ = 0x20;
          do {
            auVar44 = auVar103;
            auVar103 = vpunpcklwd_avx(ZEXT416(uVar16),
                                      ZEXT416((uint)(int)*(short *)(src + lVar14 * 3)));
            uVar16 = (uint)*(short *)(src + lVar14 * 4);
            auVar93 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(src + lVar14 * 3)),
                                     ZEXT416(uVar16));
            auVar92 = vpmaddubsw_avx(auVar44,auVar74);
            auVar103 = vpunpcklbw_avx(auVar103,auVar93);
            auVar40 = vpmaddubsw_avx(auVar40,auVar38);
            auVar40 = vpaddw_avx(auVar40,auVar92);
            auVar40 = vpaddw_avx(auVar40,auVar71);
            auVar92 = vpmaddubsw_avx(auVar103,auVar39);
            auVar40 = vpaddw_avx(auVar40,auVar92);
            auVar40 = vpsraw_avx(auVar40,6);
            auVar40 = vpackuswb_avx(auVar40,auVar40);
            vpextrw_avx(auVar40,0);
            vpextrw_avx(auVar40,1);
            src = src + lVar15;
            h = h + -2;
            auVar40 = auVar44;
          } while (h != 0);
        }
        else {
          lVar14 = (long)src_stride;
          uVar1 = *(uint *)src;
          uVar18 = (ulong)uVar1;
          uVar2 = *(uint *)(*pauVar29 + lVar14 * 3);
          puVar32 = (uint8_t *)(ulong)uVar2;
          uVar16 = *(uint *)(*pauVar29 + lVar14 * 4);
          auVar40 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar29),*(uint *)(*pauVar29 + lVar14),1);
          auVar103 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar14)),uVar1,1);
          auVar92 = vpunpcklbw_avx(auVar40,auVar103);
          auVar40 = vpinsrd_avx(ZEXT416(uVar1),uVar2,1);
          auVar103 = vpinsrd_avx(ZEXT416(uVar2),*(undefined4 *)(*pauVar29 + lVar14 * 4),1);
          auVar40 = vpunpcklbw_avx(auVar40,auVar103);
          local_5e0._8_2_ = 0x20;
          local_5e0._0_8_ = 0x20002000200020;
          local_5e0._10_2_ = 0x20;
          local_5e0._12_2_ = 0x20;
          local_5e0._14_2_ = 0x20;
          do {
            auVar103 = vpinsrd_avx(ZEXT416(uVar16),*(uint *)(src + lVar14 * 3),1);
            uVar16 = *(uint *)(src + lVar14 * 4);
            auVar93 = vpinsrd_avx(ZEXT416(*(uint *)(src + lVar14 * 3)),
                                  *(undefined4 *)(src + lVar14 * 4),1);
            auVar93 = vpunpcklbw_avx(auVar103,auVar93);
            auVar103 = vpmaddubsw_avx(auVar92,auVar38);
            auVar92 = vpmaddubsw_avx(auVar40,auVar74);
            auVar103 = vpaddw_avx(auVar103,auVar92);
            auVar103 = vpaddw_avx(auVar103,local_5e0);
            auVar92 = vpmaddubsw_avx(auVar93,auVar39);
            auVar103 = vpaddw_avx(auVar103,auVar92);
            vpsraw_avx(auVar103,6);
            res[1] = (long)dst_stride;
            res[0] = (longlong)dst;
            pack_store_4x2_sse2(res,puVar32,uVar18);
            dst = dst + dst_stride * 2;
            src = src + lVar15;
            h = h + -2;
            puVar32 = extraout_RDX_00;
            auVar92 = auVar40;
            auVar40 = auVar93;
          } while (h != 0);
        }
      }
      else {
        prepare_half_coeffs_6tap_avx2(filter_params_y,subpel_y_qn,&local_3a0);
        if (w == 0x10) {
          lVar14 = (long)src_stride;
          auVar38 = *(undefined1 (*) [16])(*pauVar29 + lVar14);
          auVar74 = *(undefined1 (*) [16])src;
          auVar39 = *(undefined1 (*) [16])(*pauVar29 + lVar14 * 3);
          auVar40 = *(undefined1 (*) [16])(*pauVar29 + lVar14 * 4);
          auVar66._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * *pauVar29;
          auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar86._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar86._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
          auVar100._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar74;
          auVar100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
          auVar112._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar39;
          auVar112._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
          auVar150 = vpunpcklbw_avx2(auVar66,auVar86);
          auVar165 = vpunpcklbw_avx2(auVar100,auVar112);
          auVar51 = vpunpckhbw_avx2(auVar66,auVar86);
          auVar137 = vpunpckhbw_avx2(auVar100,auVar112);
          auVar113._8_2_ = 0x20;
          auVar113._0_8_ = 0x20002000200020;
          auVar113._10_2_ = 0x20;
          auVar113._12_2_ = 0x20;
          auVar113._14_2_ = 0x20;
          auVar113._16_2_ = 0x20;
          auVar113._18_2_ = 0x20;
          auVar113._20_2_ = 0x20;
          auVar113._22_2_ = 0x20;
          auVar113._24_2_ = 0x20;
          auVar113._26_2_ = 0x20;
          auVar113._28_2_ = 0x20;
          auVar113._30_2_ = 0x20;
          do {
            auVar150 = vpmaddubsw_avx2(auVar150,(undefined1  [32])local_3a0);
            auVar124 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar38 = *(undefined1 (*) [16])(src + lVar14 * 3);
            auVar162._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar40;
            auVar162._16_16_ = ZEXT116(1) * auVar38;
            auVar40 = *(undefined1 (*) [16])(src + lVar14 * 4);
            auVar166._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar38;
            auVar166._16_16_ = ZEXT116(1) * auVar40;
            auVar51 = vpmaddubsw_avx2(auVar165,(undefined1  [32])local_380);
            auVar131 = vpunpcklbw_avx2(auVar162,auVar166);
            auVar154 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
            auVar133 = vpunpckhbw_avx2(auVar162,auVar166);
            auVar51 = vpaddw_avx2(auVar150,auVar51);
            auVar88 = vpmaddubsw_avx2(auVar131,(undefined1  [32])local_360);
            auVar150 = vpaddw_avx2(auVar124,auVar154);
            auVar124 = vpmaddubsw_avx2(auVar133,(undefined1  [32])local_360);
            auVar51 = vpaddw_avx2(auVar51,auVar113);
            auVar51 = vpaddw_avx2(auVar51,auVar88);
            auVar154 = vpsraw_avx2(auVar51,6);
            auVar51 = vpaddw_avx2(auVar150,auVar113);
            auVar51 = vpaddw_avx2(auVar51,auVar124);
            auVar51 = vpsraw_avx2(auVar51,6);
            auVar51 = vpackuswb_avx2(auVar154,auVar51);
            *(undefined1 (*) [16])dst = auVar51._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar51._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            src = src + lVar15;
            h = h + -2;
            auVar51 = auVar137;
            auVar150 = auVar165;
            auVar137 = auVar133;
            auVar165 = auVar131;
          } while (h != 0);
        }
        else if (w == 8) {
          lVar14 = (long)src_stride;
          uVar18 = *(ulong *)(*pauVar29 + lVar14 * 4);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(*pauVar29 + lVar14);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)*pauVar29;
          auVar64._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar57;
          auVar64._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)src;
          auVar80._0_16_ = ZEXT116(0) * auVar90 + ZEXT116(1) * auVar73;
          auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar90;
          auVar51 = vpunpcklbw_avx2(auVar64,auVar80);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(*pauVar29 + lVar14 * 3);
          auVar81._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar90;
          auVar81._16_16_ = ZEXT116(1) * auVar58;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar18;
          auVar65._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar58;
          auVar65._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
          auVar137 = vpunpcklbw_avx2(auVar81,auVar65);
          auVar109._8_2_ = 0x20;
          auVar109._0_8_ = 0x20002000200020;
          auVar109._10_2_ = 0x20;
          auVar109._12_2_ = 0x20;
          auVar109._14_2_ = 0x20;
          auVar109._16_2_ = 0x20;
          auVar109._18_2_ = 0x20;
          auVar109._20_2_ = 0x20;
          auVar109._22_2_ = 0x20;
          auVar109._24_2_ = 0x20;
          auVar109._26_2_ = 0x20;
          auVar109._28_2_ = 0x20;
          auVar109._30_2_ = 0x20;
          do {
            auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar125._8_8_ = 0;
            auVar125._0_8_ = *(ulong *)(src + lVar14 * 3);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar18;
            auVar146._0_16_ = ZEXT116(0) * auVar125 + ZEXT116(1) * auVar42;
            auVar146._16_16_ = ZEXT116(1) * auVar125;
            uVar18 = *(ulong *)(src + lVar14 * 4);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar18;
            auVar153._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar125;
            auVar153._16_16_ = ZEXT116(1) * auVar43;
            auVar150 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
            auVar165 = vpunpcklbw_avx2(auVar146,auVar153);
            auVar51 = vpaddw_avx2(auVar150,auVar51);
            auVar51 = vpaddw_avx2(auVar51,auVar109);
            auVar150 = vpmaddubsw_avx2(auVar165,(undefined1  [32])local_360);
            auVar51 = vpaddw_avx2(auVar150,auVar51);
            auVar51 = vpsraw_avx2(auVar51,6);
            auVar51 = vpackuswb_avx2(auVar51,ZEXT832(uVar18));
            *(long *)dst = auVar51._0_8_;
            *(long *)(dst + dst_stride) = auVar51._16_8_;
            dst = dst + dst_stride * 2;
            src = src + lVar15;
            h = h + -2;
            auVar51 = auVar137;
            auVar137 = auVar165;
          } while (h != 0);
        }
        else {
          lVar14 = (long)src_stride;
          puVar32 = src + lVar14 * 4;
          puVar31 = src + lVar14 * 3;
          uVar18 = 0;
          do {
            puVar21 = dst + uVar18;
            auVar51 = *(undefined1 (*) [32])(*pauVar29 + lVar14 + uVar18);
            auVar137 = *(undefined1 (*) [32])(*pauVar29 + lVar15 + uVar18);
            auVar150 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 3 + uVar18);
            auVar165 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 4 + uVar18);
            auVar88 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar29 + uVar18),auVar51);
            auVar133 = vpunpcklbw_avx2(auVar137,auVar150);
            auVar124 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar29 + uVar18),auVar51);
            auVar154 = vpunpckhbw_avx2(auVar137,auVar150);
            auVar131 = vpunpcklbw_avx2(auVar51,auVar137);
            auVar155 = vpunpcklbw_avx2(auVar150,auVar165);
            auVar51 = vpunpckhbw_avx2(auVar51,auVar137);
            auVar137 = vpunpckhbw_avx2(auVar150,auVar165);
            lVar22 = 0;
            iVar13 = h;
            do {
              auVar150 = *(undefined1 (*) [32])(puVar31 + lVar22);
              auVar139 = vpunpcklbw_avx2(auVar165,auVar150);
              auVar87 = vpunpckhbw_avx2(auVar165,auVar150);
              auVar165 = vpmaddubsw_avx2(auVar88,(undefined1  [32])local_3a0);
              auVar88 = vpmaddubsw_avx2(auVar133,(undefined1  [32])local_380);
              auVar165 = vpaddw_avx2(auVar88,auVar165);
              auVar88 = vpmaddubsw_avx2(auVar139,(undefined1  [32])local_360);
              local_460 = (__m256i)vpaddw_avx2(auVar165,auVar88);
              auVar165 = *(undefined1 (*) [32])(puVar32 + lVar22);
              auVar124 = vpmaddubsw_avx2(auVar124,(undefined1  [32])local_3a0);
              auVar88 = vpmaddubsw_avx2(auVar154,(undefined1  [32])local_380);
              auVar124 = vpaddw_avx2(auVar88,auVar124);
              auVar88 = vpmaddubsw_avx2(auVar87,(undefined1  [32])local_360);
              local_440 = vpaddw_avx2(auVar124,auVar88);
              auVar83 = vpunpcklbw_avx2(auVar150,auVar165);
              auVar124 = vpmaddubsw_avx2(auVar131,(undefined1  [32])local_3a0);
              auVar88 = vpmaddubsw_avx2(auVar155,(undefined1  [32])local_380);
              auVar124 = vpaddw_avx2(auVar88,auVar124);
              auVar88 = vpmaddubsw_avx2(auVar83,(undefined1  [32])local_360);
              local_420 = vpaddw_avx2(auVar124,auVar88);
              auVar82 = vpunpckhbw_avx2(auVar150,auVar165);
              auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
              auVar150 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
              auVar51 = vpaddw_avx2(auVar150,auVar51);
              auVar150 = vpmaddubsw_avx2(auVar82,(undefined1  [32])local_360);
              local_400 = vpaddw_avx2(auVar51,auVar150);
              sr_y_round_store_32x2_avx2(&local_460,puVar21,dst_stride);
              puVar21 = puVar21 + dst_stride * 2;
              lVar22 = lVar22 + lVar15;
              iVar13 = iVar13 + -2;
              auVar51 = auVar137;
              auVar124 = auVar154;
              auVar131 = auVar155;
              auVar88 = auVar133;
              auVar137 = auVar82;
              auVar133 = auVar139;
              auVar154 = auVar87;
              auVar155 = auVar83;
            } while (iVar13 != 0);
            uVar18 = uVar18 + 0x20;
            puVar32 = puVar32 + 0x20;
            puVar31 = puVar31 + 0x20;
          } while (uVar18 < (uint)w);
        }
      }
      break;
    case 8:
      lVar15 = (long)(src_stride * 3);
      pauVar29 = (undefined1 (*) [16])(src + -lVar15);
      if (w < 5) {
        auVar40 = vpsraw_avx(*(undefined1 (*) [16])
                              (filter_params_y->filter_ptr +
                              (uint)filter_params_y->taps * (subpel_y_qn & 0xfU)),1);
        auVar38 = vpshufb_avx(auVar40,_DAT_0046d970);
        auVar74 = vpshufb_avx(auVar40,_DAT_0046d980);
        auVar39 = vpshufb_avx(auVar40,_DAT_0046d990);
        auVar40 = vpshufb_avx(auVar40,_DAT_0046d9a0);
        if (w == 2) {
          lVar15 = (long)src_stride;
          uVar16 = (uint)*(short *)(*pauVar29 + lVar15 * 6);
          auVar103 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)*pauVar29),
                                    ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15)));
          auVar92 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15)),
                                   ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 2)));
          auVar103 = vpunpcklbw_avx(auVar103,auVar92);
          auVar92 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 2)),
                                   ZEXT416((uint)(int)*(short *)src));
          auVar93 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)src),
                                   ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 4)));
          auVar92 = vpunpcklbw_avx(auVar92,auVar93);
          auVar93 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 4)),
                                   ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 5)));
          auVar44 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 5)),
                                   ZEXT416(uVar16));
          auVar93 = vpunpcklbw_avx(auVar93,auVar44);
          auVar72._8_2_ = 0x20;
          auVar72._0_8_ = 0x20002000200020;
          auVar72._10_2_ = 0x20;
          auVar72._12_2_ = 0x20;
          auVar72._14_2_ = 0x20;
          do {
            auVar103 = vpmaddubsw_avx(auVar103,auVar38);
            auVar44 = vpmaddubsw_avx(auVar92,auVar74);
            auVar45 = vpunpcklwd_avx(ZEXT416(uVar16),
                                     ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 7)));
            uVar16 = (uint)*(short *)(*pauVar29 + lVar15 * 8);
            auVar117 = vpunpcklwd_avx(ZEXT416((uint)(int)*(short *)(*pauVar29 + lVar15 * 7)),
                                      ZEXT416(uVar16));
            auVar45 = vpunpcklbw_avx(auVar45,auVar117);
            auVar103 = vpaddw_avx(auVar103,auVar44);
            auVar44 = vpmaddubsw_avx(auVar93,auVar39);
            auVar103 = vpaddw_avx(auVar103,auVar44);
            auVar103 = vpaddw_avx(auVar103,auVar72);
            auVar44 = vpmaddubsw_avx(auVar45,auVar40);
            auVar103 = vpaddw_avx(auVar103,auVar44);
            auVar103 = vpsraw_avx(auVar103,6);
            auVar103 = vpackuswb_avx(auVar103,auVar103);
            vpextrw_avx(auVar103,0);
            vpextrw_avx(auVar103,1);
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
            h = h + -2;
            auVar103 = auVar92;
            auVar92 = auVar93;
            auVar93 = auVar45;
          } while (h != 0);
        }
        else {
          lVar15 = (long)src_stride;
          uVar16 = *(uint *)src;
          puVar32 = (uint8_t *)(ulong)uVar16;
          auVar103 = vpinsrd_avx(ZEXT416(*(uint *)*pauVar29),*(uint *)(*pauVar29 + lVar15),1);
          auVar92 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar15)),
                                *(uint *)(*pauVar29 + lVar15 * 2),1);
          auVar93 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar15 * 2)),uVar16,1);
          stride_00 = lVar15 * 6;
          auVar44 = vpinsrd_avx(ZEXT416(uVar16),*(uint *)(*pauVar29 + lVar15 * 4),1);
          auVar45 = vpunpcklbw_avx(auVar103,auVar92);
          auVar103 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar15 * 4)),
                                 *(uint *)(*pauVar29 + lVar15 * 5),1);
          auVar93 = vpunpcklbw_avx(auVar93,auVar44);
          auVar92 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar15 * 5)),
                                *(undefined4 *)(*pauVar29 + stride_00),1);
          uVar16 = *(uint *)(*pauVar29 + stride_00);
          auVar103 = vpunpcklbw_avx(auVar103,auVar92);
          local_600._8_2_ = 0x20;
          local_600._0_8_ = 0x20002000200020;
          local_600._10_2_ = 0x20;
          local_600._12_2_ = 0x20;
          local_600._14_2_ = 0x20;
          do {
            auVar117 = auVar103;
            auVar103 = vpinsrd_avx(ZEXT416(uVar16),*(uint *)(*pauVar29 + lVar15 * 7),1);
            uVar16 = *(uint *)(*pauVar29 + lVar15 * 8);
            auVar92 = vpinsrd_avx(ZEXT416(*(uint *)(*pauVar29 + lVar15 * 7)),
                                  *(undefined4 *)(*pauVar29 + lVar15 * 8),1);
            auVar103 = vpunpcklbw_avx(auVar103,auVar92);
            auVar92 = vpmaddubsw_avx(auVar45,auVar38);
            auVar44 = vpmaddubsw_avx(auVar93,auVar74);
            auVar92 = vpaddw_avx(auVar92,auVar44);
            auVar44 = vpmaddubsw_avx(auVar117,auVar39);
            auVar92 = vpaddw_avx(auVar92,auVar44);
            auVar92 = vpaddw_avx(auVar92,local_600);
            auVar44 = vpmaddubsw_avx(auVar103,auVar40);
            auVar92 = vpaddw_avx(auVar92,auVar44);
            vpsraw_avx(auVar92,6);
            res_01[1] = (long)dst_stride;
            res_01[0] = (longlong)dst;
            pack_store_4x2_sse2(res_01,puVar32,stride_00);
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
            dst = dst + dst_stride * 2;
            h = h + -2;
            puVar32 = extraout_RDX_02;
            auVar45 = auVar93;
            auVar93 = auVar117;
          } while (h != 0);
        }
      }
      else {
        prepare_half_coeffs_8tap_avx2(filter_params_y,subpel_y_qn,&local_3a0);
        if (w == 0x10) {
          lVar15 = (long)src_stride;
          auVar38 = *(undefined1 (*) [16])(*pauVar29 + lVar15);
          auVar74 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
          auVar39 = *(undefined1 (*) [16])src;
          auVar40 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 4);
          auVar103 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 5);
          auVar92 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 6);
          auVar51._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * *pauVar29;
          auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar137._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar38;
          auVar137._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
          auVar150._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar74;
          auVar150._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
          auVar88._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar39;
          auVar88._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
          auVar133._0_16_ = ZEXT116(0) * auVar103 + ZEXT116(1) * auVar40;
          auVar133._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
          auVar131._0_16_ = ZEXT116(0) * auVar92 + ZEXT116(1) * auVar103;
          auVar131._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar92;
          auVar165 = vpunpcklbw_avx2(auVar51,auVar137);
          auVar124 = vpunpcklbw_avx2(auVar150,auVar88);
          auVar154 = vpunpcklbw_avx2(auVar133,auVar131);
          auVar51 = vpunpckhbw_avx2(auVar51,auVar137);
          auVar137 = vpunpckhbw_avx2(auVar150,auVar88);
          auVar150 = vpunpckhbw_avx2(auVar133,auVar131);
          auVar155._8_2_ = 0x20;
          auVar155._0_8_ = 0x20002000200020;
          auVar155._10_2_ = 0x20;
          auVar155._12_2_ = 0x20;
          auVar155._14_2_ = 0x20;
          auVar155._16_2_ = 0x20;
          auVar155._18_2_ = 0x20;
          auVar155._20_2_ = 0x20;
          auVar155._22_2_ = 0x20;
          auVar155._24_2_ = 0x20;
          auVar155._26_2_ = 0x20;
          auVar155._28_2_ = 0x20;
          auVar155._30_2_ = 0x20;
          do {
            auVar82 = auVar154;
            auVar165 = vpmaddubsw_avx2(auVar165,(undefined1  [32])local_3a0);
            auVar88 = vpmaddubsw_avx2(auVar124,(undefined1  [32])local_380);
            auVar133 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar131 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
            auVar38 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 7);
            auVar87._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar92;
            auVar87._16_16_ = ZEXT116(1) * auVar38;
            auVar92 = *(undefined1 (*) [16])(*pauVar29 + lVar15 * 8);
            auVar139._0_16_ = ZEXT116(0) * auVar92 + ZEXT116(1) * auVar38;
            auVar139._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar92;
            auVar154 = vpunpcklbw_avx2(auVar87,auVar139);
            auVar87 = vpunpckhbw_avx2(auVar87,auVar139);
            auVar51 = vpaddw_avx2(auVar165,auVar88);
            auVar165 = vpmaddubsw_avx2(auVar82,(undefined1  [32])local_360);
            auVar51 = vpaddw_avx2(auVar165,auVar51);
            auVar88 = vpmaddubsw_avx2(auVar154,(undefined1  [32])local_340);
            auVar165 = vpaddw_avx2(auVar133,auVar131);
            auVar133 = vpmaddubsw_avx2(auVar150,(undefined1  [32])local_360);
            auVar165 = vpaddw_avx2(auVar165,auVar133);
            auVar133 = vpmaddubsw_avx2(auVar87,(undefined1  [32])local_340);
            auVar51 = vpaddw_avx2(auVar155,auVar51);
            auVar51 = vpaddw_avx2(auVar88,auVar51);
            auVar88 = vpsraw_avx2(auVar51,6);
            auVar51 = vpaddw_avx2(auVar165,auVar155);
            auVar51 = vpaddw_avx2(auVar51,auVar133);
            auVar51 = vpsraw_avx2(auVar51,6);
            auVar51 = vpackuswb_avx2(auVar88,auVar51);
            *(undefined1 (*) [16])dst = auVar51._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar51._16_16_;
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            h = h + -2;
            auVar51 = auVar137;
            auVar165 = auVar124;
            auVar137 = auVar150;
            auVar150 = auVar87;
            auVar124 = auVar82;
          } while (h != 0);
        }
        else if (w == 8) {
          lVar15 = (long)src_stride;
          uVar18 = *(ulong *)(*pauVar29 + lVar15 * 6);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)(*pauVar29 + lVar15);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)*pauVar29;
          auVar165._0_16_ = ZEXT116(0) * auVar103 + ZEXT116(1) * auVar74;
          auVar165._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar103;
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(*pauVar29 + lVar15 * 2);
          auVar82._0_16_ = ZEXT116(0) * auVar92 + ZEXT116(1) * auVar103;
          auVar82._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar92;
          auVar51 = vpunpcklbw_avx2(auVar165,auVar82);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)src;
          auVar83._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar92;
          auVar83._16_16_ = ZEXT116(1) * auVar39;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(*pauVar29 + lVar15 * 4);
          auVar124._0_16_ = ZEXT116(0) * auVar93 + ZEXT116(1) * auVar39;
          auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar93;
          auVar137 = vpunpcklbw_avx2(auVar83,auVar124);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(*pauVar29 + lVar15 * 5);
          auVar84._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar93;
          auVar84._16_16_ = ZEXT116(1) * auVar40;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar18;
          auVar154._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar40;
          auVar154._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
          auVar150 = vpunpcklbw_avx2(auVar84,auVar154);
          auVar130._8_2_ = 0x20;
          auVar130._0_8_ = 0x20002000200020;
          auVar130._10_2_ = 0x20;
          auVar130._12_2_ = 0x20;
          auVar130._14_2_ = 0x20;
          auVar130._16_2_ = 0x20;
          auVar130._18_2_ = 0x20;
          auVar130._20_2_ = 0x20;
          auVar130._22_2_ = 0x20;
          auVar130._24_2_ = 0x20;
          auVar130._26_2_ = 0x20;
          auVar130._28_2_ = 0x20;
          auVar130._30_2_ = 0x20;
          do {
            auVar124 = auVar150;
            auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
            auVar165 = vpmaddubsw_avx2(auVar137,(undefined1  [32])local_380);
            auVar117._8_8_ = 0;
            auVar117._0_8_ = *(ulong *)(*pauVar29 + lVar15 * 7);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar18;
            auVar161._0_16_ = ZEXT116(0) * auVar117 + ZEXT116(1) * auVar44;
            auVar161._16_16_ = ZEXT116(1) * auVar117;
            uVar18 = *(ulong *)(*pauVar29 + lVar15 * 8);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar18;
            auVar123._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar117;
            auVar123._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            auVar150 = vpunpcklbw_avx2(auVar161,auVar123);
            auVar51 = vpaddw_avx2(auVar51,auVar165);
            auVar165 = vpmaddubsw_avx2(auVar124,(undefined1  [32])local_360);
            auVar51 = vpaddw_avx2(auVar51,auVar165);
            auVar51 = vpaddw_avx2(auVar51,auVar130);
            auVar165 = vpmaddubsw_avx2(auVar150,(undefined1  [32])local_340);
            auVar51 = vpaddw_avx2(auVar51,auVar165);
            auVar51 = vpsraw_avx2(auVar51,6);
            auVar51 = vpackuswb_avx2(auVar51,ZEXT832(uVar18));
            *(long *)dst = auVar51._0_8_;
            *(long *)(dst + dst_stride) = auVar51._16_8_;
            pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar15 * 2);
            dst = dst + dst_stride * 2;
            h = h + -2;
            auVar51 = auVar137;
            auVar137 = auVar124;
          } while (h != 0);
        }
        else {
          lVar14 = (long)src_stride;
          auVar163 = ZEXT3264((undefined1  [32])local_360);
          auVar167 = ZEXT3264((undefined1  [32])local_340);
          puVar32 = src + (lVar14 * 8 - lVar15);
          puVar31 = src + (lVar14 * 7 - lVar15);
          uVar18 = 0;
          local_200._0_8_ = local_360[0];
          local_200._8_8_ = local_360[1];
          local_200._16_8_ = local_360[2];
          local_200._24_8_ = local_360[3];
          local_220._0_8_ = local_340[0];
          local_220._8_8_ = local_340[1];
          local_220._16_8_ = local_340[2];
          local_220._24_8_ = local_340[3];
          do {
            puVar21 = dst + uVar18;
            auVar51 = *(undefined1 (*) [32])(*pauVar29 + lVar14 + uVar18);
            auVar137 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 2 + uVar18);
            auVar150 = *(undefined1 (*) [32])(*pauVar29 + lVar15 + uVar18);
            auVar165 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 4 + uVar18);
            auVar124 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 5 + uVar18);
            local_720 = *(undefined1 (*) [32])(*pauVar29 + lVar14 * 6 + uVar18);
            auVar133 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar29 + uVar18),auVar51);
            auVar131 = vpunpcklbw_avx2(auVar137,auVar150);
            local_6e0 = vpunpcklbw_avx2(auVar165,auVar124);
            auVar154 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar29 + uVar18),auVar51);
            auVar88 = vpunpckhbw_avx2(auVar137,auVar150);
            local_680 = vpunpckhbw_avx2(auVar165,auVar124);
            auVar155 = vpunpcklbw_avx2(auVar51,auVar137);
            auVar87 = vpunpcklbw_avx2(auVar150,auVar165);
            local_6a0 = vpunpcklbw_avx2(auVar124,local_720);
            auVar51 = vpunpckhbw_avx2(auVar51,auVar137);
            local_740 = vpunpckhbw_avx2(auVar150,auVar165);
            local_6c0 = vpunpckhbw_avx2(auVar124,local_720);
            lVar22 = 0;
            iVar13 = h;
            do {
              auVar83 = auVar88;
              auVar88 = local_740;
              auVar137 = *(undefined1 (*) [32])(puVar31 + lVar22);
              auVar82 = vpunpcklbw_avx2(local_720,auVar137);
              auVar124 = vpunpckhbw_avx2(local_720,auVar137);
              auVar150 = vpmaddubsw_avx2(auVar133,(undefined1  [32])local_3a0);
              auVar165 = vpmaddubsw_avx2(auVar131,(undefined1  [32])local_380);
              auVar150 = vpaddw_avx2(auVar165,auVar150);
              auVar133 = auVar163._0_32_;
              auVar165 = vpmaddubsw_avx2(local_6e0,auVar133);
              auVar150 = vpaddw_avx2(auVar150,auVar165);
              auVar84 = auVar167._0_32_;
              auVar165 = vpmaddubsw_avx2(auVar82,auVar84);
              local_460 = (__m256i)vpaddw_avx2(auVar150,auVar165);
              local_720 = *(undefined1 (*) [32])(puVar32 + lVar22);
              auVar150 = vpmaddubsw_avx2(auVar154,(undefined1  [32])local_3a0);
              auVar165 = vpmaddubsw_avx2(auVar83,(undefined1  [32])local_380);
              auVar150 = vpaddw_avx2(auVar165,auVar150);
              auVar165 = vpmaddubsw_avx2(local_680,auVar133);
              auVar150 = vpaddw_avx2(auVar150,auVar165);
              auVar165 = vpmaddubsw_avx2(auVar124,auVar84);
              local_440 = vpaddw_avx2(auVar150,auVar165);
              auVar139 = vpunpcklbw_avx2(auVar137,local_720);
              auVar150 = vpmaddubsw_avx2(auVar155,(undefined1  [32])local_3a0);
              auVar165 = vpmaddubsw_avx2(auVar87,(undefined1  [32])local_380);
              auVar150 = vpaddw_avx2(auVar165,auVar150);
              auVar165 = vpmaddubsw_avx2(local_6a0,auVar133);
              auVar150 = vpaddw_avx2(auVar150,auVar165);
              auVar165 = vpmaddubsw_avx2(auVar139,auVar84);
              local_420 = vpaddw_avx2(auVar150,auVar165);
              auVar150 = vpunpckhbw_avx2(auVar137,local_720);
              auVar51 = vpmaddubsw_avx2(auVar51,(undefined1  [32])local_3a0);
              auVar137 = vpmaddubsw_avx2(local_740,(undefined1  [32])local_380);
              auVar51 = vpaddw_avx2(auVar137,auVar51);
              local_740 = local_6c0;
              auVar137 = vpmaddubsw_avx2(local_6c0,auVar133);
              auVar51 = vpaddw_avx2(auVar51,auVar137);
              auVar137 = vpmaddubsw_avx2(auVar150,auVar84);
              local_400 = vpaddw_avx2(auVar51,auVar137);
              sr_y_round_store_32x2_avx2(&local_460,puVar21,dst_stride);
              auVar167 = ZEXT3264(local_220);
              auVar163 = ZEXT3264(local_200);
              puVar21 = puVar21 + dst_stride * 2;
              lVar22 = lVar22 + lVar14 * 2;
              iVar13 = iVar13 + -2;
              auVar51 = auVar88;
              auVar155 = auVar87;
              auVar133 = auVar131;
              auVar131 = local_6e0;
              auVar88 = local_680;
              auVar87 = local_6a0;
              auVar154 = auVar83;
              local_6e0 = auVar82;
              local_6c0 = auVar150;
              local_6a0 = auVar139;
              local_680 = auVar124;
            } while (iVar13 != 0);
            uVar18 = uVar18 + 0x20;
            puVar32 = puVar32 + 0x20;
            puVar31 = puVar31 + 0x20;
          } while (uVar18 < (uint)w);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_y_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_y,
                            const int32_t subpel_y_qn) {
#if CONFIG_SVT_AV1
  const int vert_tap = get_filter_tap(filter_params_y, subpel_y_qn);

  if (vert_tap == 12) {
    av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn);
  } else {
    av1_convolve_y_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_y, subpel_y_qn);
  }
#else
  av1_convolve_y_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_y, subpel_y_qn);
#endif
}